

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O3

error destructuring_bind(atom arg_name,atom val,int val_unspecified,atom env)

{
  type tVar1;
  anon_union_8_9_1d3277aa_for_value aVar2;
  long lVar3;
  uint *puVar4;
  int iVar5;
  error eVar6;
  anon_union_8_9_1d3277aa_for_value aVar7;
  type tVar8;
  anon_union_8_9_1d3277aa_for_value k;
  ulong uVar9;
  atom a;
  atom arg_name_00;
  atom expr;
  atom b;
  atom val_00;
  atom env_00;
  atom v;
  atom local_40;
  
  aVar7 = val.value;
  k = arg_name.value;
  uVar9 = arg_name._0_8_;
  tVar8 = val.type;
  do {
    eVar6 = ERROR_ARGS;
    iVar5 = (int)uVar9;
    local_40.type = tVar8;
    local_40.value = aVar7;
    if (iVar5 != 1) {
      if (iVar5 == 0) {
        eVar6 = (uint)(tVar8 != T_NIL) * 3;
      }
      else if (iVar5 == 2) {
LAB_00105398:
        v._4_4_ = 0;
        v.type = tVar8;
        v.value.pair = aVar7.pair;
        table_set_sym((table *)(env.value.fp)->_IO_read_base,k.symbol,v);
        eVar6 = ERROR_OK;
      }
      return eVar6;
    }
    tVar1 = ((k.pair)->car).type;
    aVar2 = (anon_union_8_9_1d3277aa_for_value)(k.fp)->_IO_read_ptr;
    b._4_4_ = 0;
    b.type = sym_o.type;
    a._4_4_ = 0;
    a.type = tVar1;
    a.value.pair = aVar2.pair;
    b.value.number = sym_o.value.number;
    iVar5 = is(a,b);
    if (iVar5 != 0) {
      if (((val_unspecified != 0) && (lVar3 = (*k.jb)[0].__jmpbuf[3], *(int *)(lVar3 + 0x10) != 0))
         && (puVar4 = *(uint **)(lVar3 + 0x18), expr._4_4_ = 0, expr.type = *puVar4,
            env_00._4_4_ = 0, env_00.type = env.type,
            expr.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(puVar4 + 2))->pair,
            env_00.value.number = env.value.number, eVar6 = eval_expr(expr,env_00,&local_40),
            aVar7 = local_40.value, tVar8 = local_40.type, eVar6 != ERROR_OK)) {
        return eVar6;
      }
      k = (anon_union_8_9_1d3277aa_for_value)
          ((anon_union_8_9_1d3277aa_for_value *)((*k.jb)[0].__jmpbuf[3] + 8))->symbol;
      goto LAB_00105398;
    }
    if (tVar8 != T_CONS) {
      return ERROR_ARGS;
    }
    val_00._4_4_ = 0;
    val_00.type = ((aVar7.pair)->car).type;
    arg_name_00._4_4_ = 0;
    arg_name_00.type = tVar1;
    arg_name_00.value.pair = aVar2.pair;
    val_00.value.symbol = (aVar7.fp)->_IO_read_ptr;
    eVar6 = destructuring_bind(arg_name_00,val_00,0,env);
    if (eVar6 != ERROR_OK) {
      return eVar6;
    }
    tVar8 = ((aVar7.pair)->cdr).type;
    val_unspecified = (int)(tVar8 == T_NIL);
    uVar9 = (ulong)((k.pair)->cdr).type;
    k = (anon_union_8_9_1d3277aa_for_value)(k.fp)->_IO_read_base;
    aVar7 = (anon_union_8_9_1d3277aa_for_value)(aVar7.fp)->_IO_read_base;
  } while( true );
}

Assistant:

error destructuring_bind(atom arg_name, atom val, int val_unspecified, atom env) {
	switch (arg_name.type) {
	case T_SYM:
		return env_assign(env, arg_name.value.symbol, val);
	case T_CONS:
		if (is(car(arg_name), sym_o)) { /* (o ARG [DEFAULT]) */
			if (val_unspecified) { /* missing argument */
				if (!no(cdr(cdr(arg_name)))) {
					error err = eval_expr(car(cdr(cdr(arg_name))), env, &val);
					if (err) return err;
				}
			}
			return env_assign(env, car(cdr(arg_name)).value.symbol, val);
		}
		else {
			if (val.type != T_CONS) {
				return ERROR_ARGS;
			}
			error err = destructuring_bind(car(arg_name), car(val), 0, env);
			if (err) return err;
			return destructuring_bind(cdr(arg_name), cdr(val), no(cdr(val)), env);
		}
	case T_NIL:
		if (no(val))
			return ERROR_OK;
		else
			return ERROR_ARGS;
	default:
		return ERROR_ARGS;
	}
}